

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

char * build_gnu_sparse_name(char *dest,char *src)

{
  size_t sVar1;
  size_t src_length;
  char *pcVar2;
  
  if ((src == (char *)0x0) || (*src == '\0')) {
    builtin_strncpy(dest,"GNUSparseFile/blank",0x14);
    return dest;
  }
  sVar1 = strlen(src);
LAB_00526c4b:
  do {
    src_length = sVar1;
    if (0 < (long)src_length) {
      sVar1 = src_length - 1;
      if (src[src_length - 1] == '/') goto LAB_00526c4b;
    }
    if ((((long)src_length < 2) || (src[src_length - 1] != '.')) ||
       (sVar1 = src_length - 1, src[src_length - 2] != '/')) {
      pcVar2 = build_ustar_entry_name(dest,src,src_length,"GNUSparseFile.0");
      return pcVar2;
    }
  } while( true );
}

Assistant:

static char *
build_gnu_sparse_name(char *dest, const char *src)
{
	const char *p;

	/* Handle the null filename case. */
	if (src == NULL || *src == '\0') {
		strcpy(dest, "GNUSparseFile/blank");
		return (dest);
	}

	/* Prune final '/' and other unwanted final elements. */
	p = src + strlen(src);
	for (;;) {
		/* Ends in "/", remove the '/' */
		if (p > src && p[-1] == '/') {
			--p;
			continue;
		}
		/* Ends in "/.", remove the '.' */
		if (p > src + 1 && p[-1] == '.'
		    && p[-2] == '/') {
			--p;
			continue;
		}
		break;
	}

	/* General case: build a ustar-compatible name adding
	 * "/GNUSparseFile/". */
	build_ustar_entry_name(dest, src, p - src, "GNUSparseFile.0");

	return (dest);
}